

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.cpp
# Opt level: O1

void __thiscall
llvm::DWARFListTableHeader::dump(DWARFListTableHeader *this,raw_ostream *OS,DIDumpOptions DumpOpts)

{
  pointer puVar1;
  long lVar2;
  pointer puVar3;
  StringRef Str;
  StringRef Str_00;
  format_object_base local_60;
  undefined8 local_50;
  uint64_t local_48;
  char *local_40;
  char local_31;
  
  local_31 = DumpOpts.Verbose;
  if (DumpOpts.Verbose == true) {
    local_60.Fmt = "0x%8.8lx: ";
    local_60._vptr_format_object_base = (_func_int **)&PTR_home_01097f70;
    local_50 = this->HeaderOffset;
    raw_ostream::operator<<(OS,&local_60);
  }
  local_40 = (this->ListTypeString).Data;
  local_60.Fmt = 
  "%s list header: length = 0x%8.8lx, version = 0x%4.4x, addr_size = 0x%2.2x, seg_size = 0x%2.2x, offset_entry_count = 0x%8.8x\n"
  ;
  local_60._vptr_format_object_base = (_func_int **)&PTR_home_01098ab8;
  local_50 = CONCAT26((this->HeaderData).Version,
                      CONCAT15((this->HeaderData).AddrSize,
                               CONCAT14((this->HeaderData).SegSize,
                                        (this->HeaderData).OffsetEntryCount)));
  local_48 = (this->HeaderData).Length;
  raw_ostream::operator<<(OS,&local_60);
  if ((this->HeaderData).OffsetEntryCount != 0) {
    Str.Length = 10;
    Str.Data = "offsets: [";
    raw_ostream::operator<<(OS,Str);
    puVar1 = (this->Offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (this->Offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      local_60.Fmt = "\n0x%8.8lx";
      local_60._vptr_format_object_base = (_func_int **)&PTR_home_01097f70;
      local_50 = *puVar3;
      raw_ostream::operator<<(OS,&local_60);
      if (local_31 != '\0') {
        lVar2 = 0xc;
        if (this->Format != DWARF32) {
          if (this->Format != DWARF64) {
            llvm_unreachable_internal
                      ("Invalid DWARF format (expected DWARF32 or DWARF64",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFListTable.h"
                       ,0x73);
          }
          lVar2 = 0x14;
        }
        local_50 = this->HeaderOffset + *puVar3 + lVar2;
        local_60.Fmt = " => 0x%8.8lx";
        local_60._vptr_format_object_base = (_func_int **)&PTR_home_01097f70;
        raw_ostream::operator<<(OS,&local_60);
      }
    }
    Str_00.Length = 3;
    Str_00.Data = "\n]\n";
    raw_ostream::operator<<(OS,Str_00);
  }
  return;
}

Assistant:

void DWARFListTableHeader::dump(raw_ostream &OS, DIDumpOptions DumpOpts) const {
  if (DumpOpts.Verbose)
    OS << format("0x%8.8" PRIx64 ": ", HeaderOffset);
  OS << format(
      "%s list header: length = 0x%8.8" PRIx64 ", version = 0x%4.4" PRIx16 ", "
      "addr_size = 0x%2.2" PRIx8 ", seg_size = 0x%2.2" PRIx8
      ", offset_entry_count = "
      "0x%8.8" PRIx32 "\n",
      ListTypeString.data(), HeaderData.Length, HeaderData.Version,
      HeaderData.AddrSize, HeaderData.SegSize, HeaderData.OffsetEntryCount);

  if (HeaderData.OffsetEntryCount > 0) {
    OS << "offsets: [";
    for (const auto &Off : Offsets) {
      OS << format("\n0x%8.8" PRIx64, Off);
      if (DumpOpts.Verbose)
        OS << format(" => 0x%8.8" PRIx64,
                     Off + HeaderOffset + getHeaderSize(Format));
    }
    OS << "\n]\n";
  }
}